

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int ConnectNMEADevicex(NMEADEVICE *pNMEADevice,char *szCfgFilePath)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  char *szCfgFilePath_local;
  NMEADEVICE *pNMEADevice_local;
  
  local_24 = 0;
  do {
    if (addrsNMEADevice[local_24] == (void *)0x0) {
      iVar1 = ConnectNMEADevice(pNMEADevice,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsNMEADevice[local_24] = pNMEADevice;
      return 0;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectNMEADevicex(NMEADEVICE* pNMEADevice, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsNMEADevice[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectNMEADevice(pNMEADevice, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsNMEADevice[id] = pNMEADevice;

	return EXIT_SUCCESS;
}